

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.cpp
# Opt level: O3

int __thiscall
btGeneric6DofSpring2Constraint::setLinearLimits
          (btGeneric6DofSpring2Constraint *this,btConstraintInfo2 *info,int row,btTransform *transA,
          btTransform *transB,btVector3 *linVelA,btVector3 *linVelB,btVector3 *angVelA,
          btVector3 *angVelB)

{
  bool bVar1;
  int rotAllowed;
  int iVar2;
  long lVar3;
  btScalar *pbVar4;
  btScalar *pbVar5;
  uint uVar6;
  ulong uVar7;
  float fVar8;
  btRotationalLimitMotor2 local_d0;
  btVector3 *local_78;
  btVector3 *local_70;
  btVector3 *local_68;
  btVector3 *local_60;
  btTransform *local_58;
  btTransform *local_50;
  btVector3 *local_48;
  btVector3 axis;
  
  local_70 = &(this->m_linearLimits).m_stopCFM;
  local_60 = &(this->m_linearLimits).m_stopERP;
  local_78 = &(this->m_linearLimits).m_motorCFM;
  local_68 = &(this->m_linearLimits).m_motorERP;
  lVar3 = 0;
  local_58 = transA;
  local_50 = transB;
  local_48 = linVelA;
  do {
    local_d0.m_currentLimit = (this->m_linearLimits).m_currentLimit[lVar3];
    local_d0.m_enableMotor = (this->m_linearLimits).m_enableMotor[lVar3];
    if (((local_d0.m_currentLimit != 0) || ((local_d0.m_enableMotor & 1U) != 0)) ||
       ((this->m_linearLimits).m_enableSpring[lVar3] != false)) {
      local_d0.m_bounce = (this->m_linearLimits).m_bounce.m_floats[lVar3];
      local_d0.m_currentPosition = (this->m_linearLimits).m_currentLinearDiff.m_floats[lVar3];
      local_d0.m_currentLimitError = (this->m_linearLimits).m_currentLimitError.m_floats[lVar3];
      local_d0.m_currentLimitErrorHi = (this->m_linearLimits).m_currentLimitErrorHi.m_floats[lVar3];
      local_d0.m_servoMotor = (this->m_linearLimits).m_servoMotor[lVar3];
      local_d0.m_servoTarget = (this->m_linearLimits).m_servoTarget.m_floats[lVar3];
      local_d0.m_enableSpring = (this->m_linearLimits).m_enableSpring[lVar3];
      local_d0.m_springStiffness = (this->m_linearLimits).m_springStiffness.m_floats[lVar3];
      local_d0.m_springStiffnessLimited = (this->m_linearLimits).m_springStiffnessLimited[lVar3];
      local_d0.m_springDamping = (this->m_linearLimits).m_springDamping.m_floats[lVar3];
      local_d0.m_springDampingLimited = (this->m_linearLimits).m_springDampingLimited[lVar3];
      local_d0.m_equilibriumPoint = (this->m_linearLimits).m_equilibriumPoint.m_floats[lVar3];
      local_d0.m_hiLimit = (this->m_linearLimits).m_upperLimit.m_floats[lVar3];
      local_d0.m_loLimit = (this->m_linearLimits).m_lowerLimit.m_floats[lVar3];
      local_d0.m_maxMotorForce = (this->m_linearLimits).m_maxMotorForce.m_floats[lVar3];
      local_d0.m_targetVelocity = (this->m_linearLimits).m_targetVelocity.m_floats[lVar3];
      axis.m_floats[1] = (&(this->m_calculatedTransformA).m_origin)[-2].m_floats[lVar3];
      axis.m_floats[0] = (this->m_calculatedTransformA).m_basis.m_el[0].m_floats[lVar3];
      axis.m_floats[2] = (&(this->m_calculatedTransformA).m_origin)[-1].m_floats[lVar3];
      axis.m_floats[3] = 0.0;
      uVar6 = this->m_flags >> ((char)lVar3 * '\x04' & 0x1fU);
      if ((uVar6 & 1) == 0) {
        pbVar4 = info->cfm;
      }
      else {
        pbVar4 = local_70->m_floats + lVar3;
      }
      pbVar5 = local_60->m_floats + lVar3;
      if ((uVar6 & 2) == 0) {
        pbVar5 = &info->erp;
      }
      local_d0.m_stopCFM = *pbVar4;
      local_d0.m_stopERP = *pbVar5;
      if ((uVar6 & 4) == 0) {
        pbVar4 = info->cfm;
      }
      else {
        pbVar4 = local_78->m_floats + lVar3;
      }
      pbVar5 = local_68->m_floats + lVar3;
      if ((uVar6 & 8) == 0) {
        pbVar5 = &info->erp;
      }
      local_d0.m_motorCFM = *pbVar4;
      local_d0.m_motorERP = *pbVar5;
      uVar7 = 0;
      if (lVar3 != 2) {
        uVar7 = lVar3 + 1U & 0xffffffff;
      }
      iVar2 = this->m_angularLimits[uVar7].m_currentLimit;
      bVar1 = true;
      if (1 < iVar2 - 1U) {
        if (iVar2 == 4) {
          if (-0.001 <= this->m_angularLimits[uVar7].m_currentLimitError) {
            fVar8 = this->m_angularLimits[uVar7].m_currentLimitErrorHi;
            goto LAB_00194803;
          }
        }
        else if (iVar2 == 3) {
          fVar8 = ABS(this->m_angularLimits[uVar7].m_currentLimitError);
LAB_00194803:
          bVar1 = 0.001 < fVar8;
        }
        else {
          bVar1 = false;
        }
      }
      uVar7 = (ulong)((int)lVar3 - 1);
      if (lVar3 == 0) {
        uVar7 = 2;
      }
      iVar2 = this->m_angularLimits[uVar7].m_currentLimit;
      if (iVar2 - 1U < 2) {
LAB_0019487d:
        rotAllowed = 0;
      }
      else {
        rotAllowed = 1;
        if (iVar2 == 4) {
          if (-0.001 <= this->m_angularLimits[uVar7].m_currentLimitError) {
            fVar8 = this->m_angularLimits[uVar7].m_currentLimitErrorHi;
            goto LAB_00194873;
          }
          goto LAB_0019487d;
        }
        if (iVar2 == 3) {
          fVar8 = ABS(this->m_angularLimits[uVar7].m_currentLimitError);
LAB_00194873:
          if (0.001 < fVar8) goto LAB_0019487d;
        }
      }
      if (!bVar1) {
        rotAllowed = 1;
      }
      iVar2 = get_limit_motor_info2
                        (this,&local_d0,local_58,local_50,local_48,linVelB,angVelA,angVelB,info,row,
                         &axis,0,rotAllowed);
      row = iVar2 + row;
    }
    lVar3 = lVar3 + 1;
    if (lVar3 == 3) {
      return row;
    }
  } while( true );
}

Assistant:

int btGeneric6DofSpring2Constraint::setLinearLimits(btConstraintInfo2* info, int row, const btTransform& transA,const btTransform& transB,const btVector3& linVelA,const btVector3& linVelB,const btVector3& angVelA,const btVector3& angVelB)
{
	//solve linear limits
	btRotationalLimitMotor2 limot;
	for (int i=0;i<3 ;i++ )
	{
		if(m_linearLimits.m_currentLimit[i] || m_linearLimits.m_enableMotor[i] || m_linearLimits.m_enableSpring[i])
		{ // re-use rotational motor code
			limot.m_bounce                 = m_linearLimits.m_bounce[i];
			limot.m_currentLimit           = m_linearLimits.m_currentLimit[i];
			limot.m_currentPosition        = m_linearLimits.m_currentLinearDiff[i];
			limot.m_currentLimitError      = m_linearLimits.m_currentLimitError[i];
			limot.m_currentLimitErrorHi    = m_linearLimits.m_currentLimitErrorHi[i];
			limot.m_enableMotor            = m_linearLimits.m_enableMotor[i];
			limot.m_servoMotor             = m_linearLimits.m_servoMotor[i];
			limot.m_servoTarget            = m_linearLimits.m_servoTarget[i];
			limot.m_enableSpring           = m_linearLimits.m_enableSpring[i];
			limot.m_springStiffness        = m_linearLimits.m_springStiffness[i];
			limot.m_springStiffnessLimited = m_linearLimits.m_springStiffnessLimited[i];
			limot.m_springDamping          = m_linearLimits.m_springDamping[i];
			limot.m_springDampingLimited   = m_linearLimits.m_springDampingLimited[i];
			limot.m_equilibriumPoint       = m_linearLimits.m_equilibriumPoint[i];
			limot.m_hiLimit                = m_linearLimits.m_upperLimit[i];
			limot.m_loLimit                = m_linearLimits.m_lowerLimit[i];
			limot.m_maxMotorForce          = m_linearLimits.m_maxMotorForce[i];
			limot.m_targetVelocity         = m_linearLimits.m_targetVelocity[i];
			btVector3 axis = m_calculatedTransformA.getBasis().getColumn(i);
			int flags = m_flags >> (i * BT_6DOF_FLAGS_AXIS_SHIFT2);
			limot.m_stopCFM  = (flags & BT_6DOF_FLAGS_CFM_STOP2) ? m_linearLimits.m_stopCFM[i] : info->cfm[0];
			limot.m_stopERP  = (flags & BT_6DOF_FLAGS_ERP_STOP2) ? m_linearLimits.m_stopERP[i] : info->erp;
			limot.m_motorCFM = (flags & BT_6DOF_FLAGS_CFM_MOTO2) ? m_linearLimits.m_motorCFM[i] : info->cfm[0];
			limot.m_motorERP = (flags & BT_6DOF_FLAGS_ERP_MOTO2) ? m_linearLimits.m_motorERP[i] : info->erp;

			//rotAllowed is a bit of a magic from the original 6dof. The calculation of it here is something that imitates the original behavior as much as possible.
			int indx1 = (i + 1) % 3;
			int indx2 = (i + 2) % 3;
			int rotAllowed = 1; // rotations around orthos to current axis (it is used only when one of the body is static)
			#define D6_LIMIT_ERROR_THRESHOLD_FOR_ROTATION 1.0e-3
			bool indx1Violated = m_angularLimits[indx1].m_currentLimit == 1 ||
				m_angularLimits[indx1].m_currentLimit == 2 ||
				( m_angularLimits[indx1].m_currentLimit == 3 && ( m_angularLimits[indx1].m_currentLimitError < -D6_LIMIT_ERROR_THRESHOLD_FOR_ROTATION || m_angularLimits[indx1].m_currentLimitError > D6_LIMIT_ERROR_THRESHOLD_FOR_ROTATION ) ) ||
				( m_angularLimits[indx1].m_currentLimit == 4 && ( m_angularLimits[indx1].m_currentLimitError < -D6_LIMIT_ERROR_THRESHOLD_FOR_ROTATION || m_angularLimits[indx1].m_currentLimitErrorHi > D6_LIMIT_ERROR_THRESHOLD_FOR_ROTATION ) );
			bool indx2Violated = m_angularLimits[indx2].m_currentLimit == 1 ||
				m_angularLimits[indx2].m_currentLimit == 2 ||
				( m_angularLimits[indx2].m_currentLimit == 3 && ( m_angularLimits[indx2].m_currentLimitError < -D6_LIMIT_ERROR_THRESHOLD_FOR_ROTATION || m_angularLimits[indx2].m_currentLimitError > D6_LIMIT_ERROR_THRESHOLD_FOR_ROTATION ) ) ||
				( m_angularLimits[indx2].m_currentLimit == 4 && ( m_angularLimits[indx2].m_currentLimitError < -D6_LIMIT_ERROR_THRESHOLD_FOR_ROTATION || m_angularLimits[indx2].m_currentLimitErrorHi > D6_LIMIT_ERROR_THRESHOLD_FOR_ROTATION ) );
			if( indx1Violated && indx2Violated )
			{
				rotAllowed = 0;
			}
			row += get_limit_motor_info2(&limot, transA,transB,linVelA,linVelB,angVelA,angVelB, info, row, axis, 0, rotAllowed);

		}
	}
	return row;
}